

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_find(REF_GEOM ref_geom,REF_INT node,REF_INT type,REF_INT id,REF_INT *found)

{
  REF_INT local_44;
  REF_INT local_40;
  int local_3c;
  REF_INT local_38;
  int local_34;
  REF_INT geom;
  REF_INT item;
  REF_INT *found_local;
  REF_INT id_local;
  REF_INT type_local;
  REF_INT node_local;
  REF_GEOM ref_geom_local;
  
  *found = -1;
  if ((node < 0) || (ref_geom->ref_adj->nnode <= node)) {
    local_3c = -1;
  }
  else {
    local_3c = ref_geom->ref_adj->first[node];
  }
  local_34 = local_3c;
  if (local_3c == -1) {
    local_40 = -1;
  }
  else {
    local_40 = ref_geom->ref_adj->item[local_3c].ref;
  }
  local_38 = local_40;
  while( true ) {
    if (local_34 == -1) {
      return 5;
    }
    if ((type == ref_geom->descr[local_38 * 6]) && (id == ref_geom->descr[local_38 * 6 + 1])) break;
    local_34 = ref_geom->ref_adj->item[local_34].next;
    if (local_34 == -1) {
      local_44 = -1;
    }
    else {
      local_44 = ref_geom->ref_adj->item[local_34].ref;
    }
    local_38 = local_44;
  }
  *found = local_38;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_find(REF_GEOM ref_geom, REF_INT node, REF_INT type,
                                 REF_INT id, REF_INT *found) {
  REF_INT item, geom;
  *found = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    if (type == ref_geom_type(ref_geom, geom) &&
        id == ref_geom_id(ref_geom, geom)) {
      *found = geom;
      return REF_SUCCESS;
    }
  }
  return REF_NOT_FOUND;
}